

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O2

bool __thiscall
Imf_3_2::anon_unknown_0::checkCoreFile
          (anon_unknown_0 *this,exr_context_t f,bool reduceMemory,bool reduceTime)

{
  short sVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  pointer puVar5;
  bool bVar6;
  int c;
  long lVar7;
  int iVar8;
  long lVar9;
  size_type sVar10;
  long lVar11;
  int iVar12;
  uint64_t chunk;
  long lVar13;
  ulong uVar14;
  byte bVar15;
  int32_t xlevel;
  int iVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  int32_t curtw;
  int32_t lines_per_chunk;
  exr_storage_t store;
  int32_t curth;
  uint local_2bc;
  vector<unsigned_char,_std::allocator<unsigned_char>_> imgdata;
  int numparts;
  int32_t levh;
  int32_t levw;
  int32_t levelsy;
  int32_t levelsx;
  exr_attr_box2i_t datawin;
  long local_270;
  exr_tile_round_mode_t roundingmode;
  exr_tile_level_mode_t levelmode;
  uint32_t tysz;
  exr_chunk_info_t cinfo;
  exr_decode_pipeline_t decoder;
  
  iVar3 = exr_get_count();
  bVar6 = true;
  if (iVar3 == 0) {
    local_2bc = (uint)f ^ 1;
    for (iVar3 = 0; iVar3 < numparts; iVar3 = iVar3 + 1) {
      iVar4 = exr_get_storage(this,iVar3,&store);
      if (iVar4 != 0) {
        return true;
      }
      if ((store & ~EXR_STORAGE_TILED) != EXR_STORAGE_DEEP_SCANLINE) {
        if (store == EXR_STORAGE_TILED) {
          iVar4 = exr_get_data_window(this,iVar3,&datawin);
          if (iVar4 != 0) {
            return true;
          }
          iVar4 = exr_get_tile_descriptor
                            (this,iVar3,&lines_per_chunk,&tysz,&levelmode,&roundingmode);
          if (iVar4 != 0) {
            return true;
          }
          iVar4 = exr_get_tile_levels(this,iVar3,&levelsx);
          if (iVar4 != 0) {
            return true;
          }
          bVar6 = true;
          iVar4 = 0;
          for (iVar12 = 0; (bVar6 && (iVar12 < levelsy)); iVar12 = iVar12 + 1) {
            iVar16 = 0;
LAB_0011180b:
            if ((!bVar6) || (levelsx <= iVar16)) goto LAB_00111b07;
            iVar4 = exr_get_level_sizes(this,iVar3,iVar16,iVar12,&levw,&levh);
            if ((iVar4 == 0) &&
               (iVar4 = exr_get_tile_sizes(this,iVar3,iVar16,iVar12,&curtw,&curth), iVar4 == 0)) {
              imgdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              imgdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              imgdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              bVar15 = 0;
              memset(&decoder,0,0x1e0);
              iVar8 = 0;
              iVar4 = 0;
              for (local_270 = 0; (bVar6 && (local_270 < levh)); local_270 = local_270 + curth) {
                iVar18 = 0;
                for (lVar9 = 0; lVar9 < levw; lVar9 = lVar9 + curtw) {
                  iVar4 = exr_read_tile_chunk_info(this,iVar3,iVar18,iVar8,iVar16,iVar12,&cinfo);
                  if (iVar4 == 0) {
                    if (decoder.channels == (exr_coding_channel_info_t *)0x0) {
                      iVar4 = exr_decoding_initialize(this,iVar3,&cinfo);
                      if (iVar4 == 0) {
                        lVar13 = 0x28;
                        sVar10 = 0;
                        for (lVar17 = 0; lVar17 < decoder.channel_count; lVar17 = lVar17 + 1) {
                          *(size_type *)((long)&(decoder.channels)->channel_name + lVar13) =
                               sVar10 + 0x1000;
                          sVar1 = *(short *)((long)decoder.channels + lVar13 + -0xc);
                          *(int *)((long)decoder.channels + lVar13 + -8) = (int)sVar1;
                          *(int32_t *)((long)decoder.channels + lVar13 + -4) = curtw * sVar1;
                          sVar10 = sVar10 + (long)curth * (long)curtw * (long)sVar1;
                          lVar13 = lVar13 + 0x30;
                        }
                        bVar15 = sVar10 < 1000000 | (byte)local_2bc;
                        if (bVar15 != 0) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&imgdata,sVar10);
                        }
                        iVar4 = exr_decoding_choose_default_routines(this,iVar3,&decoder);
                        if (iVar4 == 0) goto LAB_00111a1e;
                      }
                      goto LAB_00111ab6;
                    }
                    iVar4 = exr_decoding_update(this,iVar3,&cinfo);
                    if (iVar4 != 0) goto LAB_0011190d;
LAB_00111a1e:
                    iVar4 = 0;
                    bVar2 = bVar15 & 1;
                    bVar15 = 0;
                    if (bVar2 != 0) {
                      lVar13 = 0x28;
                      puVar5 = imgdata.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start;
                      for (lVar17 = 0; lVar17 < decoder.channel_count; lVar17 = lVar17 + 1) {
                        *(pointer *)((long)&(decoder.channels)->channel_name + lVar13) = puVar5;
                        sVar1 = *(short *)((long)decoder.channels + lVar13 + -0xc);
                        *(int *)((long)decoder.channels + lVar13 + -8) = (int)sVar1;
                        *(int32_t *)((long)decoder.channels + lVar13 + -4) = curtw * sVar1;
                        puVar5 = puVar5 + (long)curth * (long)curtw * (long)sVar1;
                        lVar13 = lVar13 + 0x30;
                      }
                      iVar4 = exr_decoding_run(this,iVar3,&decoder);
                      bVar15 = 1;
                      if (reduceMemory && iVar4 != 0) goto LAB_00111ab6;
                    }
                  }
                  else {
LAB_0011190d:
                    if (reduceMemory) {
LAB_00111ab6:
                      bVar6 = false;
                      break;
                    }
                  }
                  iVar18 = iVar18 + 1;
                }
                iVar8 = iVar8 + 1;
              }
              exr_decoding_destroy(this,&decoder);
              std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                        (&imgdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
              ;
LAB_0011186e:
              iVar16 = iVar16 + 1;
              goto LAB_0011180b;
            }
            if (!reduceMemory) goto LAB_0011186e;
            bVar6 = false;
LAB_00111b07:
          }
        }
        else {
          if (store != EXR_STORAGE_SCANLINE) goto LAB_00111b46;
          iVar4 = exr_get_data_window(this,iVar3,&datawin);
          if (iVar4 != 0) {
            return true;
          }
          lVar17 = (long)datawin.max.field_0.field_0.x;
          lVar13 = (long)datawin.min.field_0.field_0.x;
          lVar19 = (long)datawin.max.field_0.field_0.y;
          lVar9 = (long)datawin.min.field_0.field_0.y;
          imgdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          imgdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          imgdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          memset(&decoder,0,0x1e0);
          iVar4 = exr_get_scanlines_per_chunk(this,iVar3,&lines_per_chunk);
          if (iVar4 != 0) {
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      (&imgdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
            return true;
          }
          lVar13 = (lVar17 - lVar13) + 1;
          bVar15 = 0;
          iVar4 = 0;
          for (uVar14 = 0; uVar14 < (lVar19 - lVar9) + 1U; uVar14 = uVar14 + (long)lines_per_chunk)
          {
            cinfo.sample_count_data_offset = 0;
            cinfo.sample_count_table_size = 0;
            cinfo.packed_size = 0;
            cinfo.unpacked_size = 0;
            cinfo.width = 0;
            cinfo.level_x = '\0';
            cinfo.level_y = '\0';
            cinfo.type = '\0';
            cinfo.compression = '\0';
            cinfo.data_offset = 0;
            cinfo.idx = 0;
            cinfo.start_x = 0;
            cinfo.start_y = 0;
            cinfo.height = 0;
            iVar4 = exr_read_scanline_chunk_info
                              (this,iVar3,datawin.min.field_0.field_0.y + (int)uVar14);
            if (iVar4 == 0) {
              if (decoder.channels == (exr_coding_channel_info_t *)0x0) {
                iVar4 = exr_decoding_initialize(this,iVar3,&cinfo);
                if (iVar4 != 0) goto LAB_00111b1a;
                lVar17 = 0x28;
                sVar10 = 0;
                for (lVar7 = 0; lVar7 < decoder.channel_count; lVar7 = lVar7 + 1) {
                  *(undefined8 *)((long)&(decoder.channels)->channel_name + lVar17) = 0x1000;
                  sVar1 = *(short *)((long)decoder.channels + lVar17 + -0xc);
                  *(int *)((long)decoder.channels + lVar17 + -8) = (int)sVar1;
                  lVar11 = sVar1 * lVar13;
                  *(int *)((long)decoder.channels + lVar17 + -4) = (int)lVar11;
                  sVar10 = sVar10 + lines_per_chunk * lVar11;
                  lVar17 = lVar17 + 0x30;
                }
                bVar15 = sVar10 < 8000000 | (byte)local_2bc;
                if (bVar15 != 0) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&imgdata,sVar10);
                }
                iVar4 = exr_decoding_choose_default_routines(this,iVar3,&decoder);
                if (iVar4 == 0) goto LAB_001116eb;
                break;
              }
              iVar4 = exr_decoding_update(this,iVar3,&cinfo);
              if (iVar4 != 0) goto LAB_001115f1;
LAB_001116eb:
              iVar4 = 0;
              bVar2 = bVar15 & 1;
              bVar15 = 0;
              if (bVar2 != 0) {
                lVar17 = 0x28;
                puVar5 = imgdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                for (lVar7 = 0; lVar7 < decoder.channel_count; lVar7 = lVar7 + 1) {
                  *(pointer *)((long)&(decoder.channels)->channel_name + lVar17) = puVar5;
                  sVar1 = *(short *)((long)decoder.channels + lVar17 + -0xc);
                  *(int *)((long)decoder.channels + lVar17 + -8) = (int)sVar1;
                  lVar11 = sVar1 * lVar13;
                  *(int *)((long)decoder.channels + lVar17 + -4) = (int)lVar11;
                  puVar5 = puVar5 + lines_per_chunk * lVar11;
                  lVar17 = lVar17 + 0x30;
                }
                iVar4 = exr_decoding_run(this,iVar3,&decoder);
                bVar15 = 1;
                if (reduceMemory && iVar4 != 0) break;
              }
            }
            else {
LAB_001115f1:
              if (reduceMemory) {
LAB_00111b1a:
                iVar4 = 1;
                break;
              }
            }
          }
          exr_decoding_destroy(this,&decoder);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&imgdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        }
        if (iVar4 != 0) {
          return true;
        }
      }
LAB_00111b46:
    }
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool
checkCoreFile (exr_context_t f, bool reduceMemory, bool reduceTime)
{
    exr_result_t rv;
    int          numparts;

    rv = exr_get_count (f, &numparts);
    if (rv != EXR_ERR_SUCCESS) return true;

    for (int p = 0; p < numparts; ++p)
    {
        exr_storage_t store;
        rv = exr_get_storage (f, p, &store);
        if (rv != EXR_ERR_SUCCESS) return true;

        // TODO: Need to fill this in
        if (store == EXR_STORAGE_DEEP_SCANLINE ||
            store == EXR_STORAGE_DEEP_TILED)
            continue;

        if (store == EXR_STORAGE_SCANLINE)
        {
            if (readCoreScanlinePart (f, p, reduceMemory, reduceTime))
                return true;
        }
        else if (store == EXR_STORAGE_TILED)
        {
            if (readCoreTiledPart (f, p, reduceMemory, reduceTime)) return true;
        }
    }

    return false;
}